

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O2

MPP_RET mpp_buf_slot_init(MppBufSlots *slots)

{
  long lVar1;
  RK_U32 RVar2;
  MPP_RET MVar3;
  uint uVar4;
  MppBufSlotsImpl *impl;
  Mutex *this;
  long lVar5;
  MppBufSlotLogs *pMVar6;
  
  if (slots == (MppBufSlots *)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_init");
    return MPP_ERR_NULL_PTR;
  }
  impl = (MppBufSlotsImpl *)mpp_osal_calloc("mpp_buf_slot_init",0xf0);
  if (impl == (MppBufSlotsImpl *)0x0) goto LAB_0012d3da;
  mpp_env_get_u32("buf_slot_debug",&buf_slot_debug,0x10000800);
  mpp_env_get_u32("use_legacy_align",&use_legacy_align,0);
  this = (Mutex *)operator_new(0x28);
  Mutex::Mutex(this);
  impl->lock = this;
  for (lVar5 = 0xa0; lVar5 != 0xe0; lVar5 = lVar5 + 0x10) {
    lVar1 = (long)&impl->lock + lVar5;
    *(long *)((long)&impl->lock + lVar5) = lVar1;
    *(long *)((long)&impl->slots_idx + lVar5) = lVar1;
  }
  if ((buf_slot_debug & 0x10000000) == 0) {
LAB_0012d302:
    MVar3 = mpp_frame_init(&impl->info);
    if ((MVar3 == MPP_OK) && (MVar3 = mpp_frame_init(&impl->info_set), MVar3 == MPP_OK)) {
      impl->hal_hor_align = default_align_16;
      impl->hal_ver_align = default_align_16;
      impl->hal_len_align = (AlignFunc)0x0;
      impl->numerator = 9;
      impl->denominator = 5;
      RVar2 = buf_slot_idx + 1;
      impl->slots_idx = buf_slot_idx;
      buf_slot_idx = RVar2;
      impl->info_change_slot_idx = -1;
      uVar4 = buf_slot_debug >> 0xb & 1;
      impl->align_chk_log_env = uVar4;
      impl->align_chk_log_en = uVar4;
      *slots = impl;
      return MPP_OK;
    }
  }
  else {
    pMVar6 = (MppBufSlotLogs *)mpp_osal_malloc("buf_slot_logs_init",0x4038);
    if (pMVar6 != (MppBufSlotLogs *)0x0) {
      pMVar6->logs = (MppBufSlotLog *)(pMVar6 + 1);
      pMVar6->max_count = 0x400;
      pMVar6->log_count = 0;
      pMVar6->log_write = 0;
      pMVar6->log_read = 0;
      impl->logs = pMVar6;
      goto LAB_0012d302;
    }
    _mpp_log_l(2,"mpp_buf_slot","failed to create %d buf slot logs\n","buf_slot_logs_init",0x400);
    impl->logs = (MppBufSlotLogs *)0x0;
  }
  clear_slots_impl(impl);
LAB_0012d3da:
  *slots = (MppBufSlots)0x0;
  return MPP_NOK;
}

Assistant:

MPP_RET mpp_buf_slot_init(MppBufSlots *slots)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }
    MppBufSlotsImpl *impl = mpp_calloc(MppBufSlotsImpl, 1);
    if (NULL == impl) {
        *slots = NULL;
        return MPP_NOK;
    }

    mpp_env_get_u32("buf_slot_debug", &buf_slot_debug,
                    BUF_SLOT_DBG_OPS_HISTORY | BUF_SLOT_DBG_INFO_SET);
    mpp_env_get_u32("use_legacy_align", &use_legacy_align, 0);

    do {
        impl->lock = new Mutex();
        if (NULL == impl->lock)
            break;

        for (RK_U32 i = 0; i < MPP_ARRAY_ELEMS(impl->queue); i++) {
            INIT_LIST_HEAD(&impl->queue[i]);
        }

        if (buf_slot_debug & BUF_SLOT_DBG_OPS_HISTORY) {
            impl->logs = buf_slot_logs_init(SLOT_OPS_MAX_COUNT);
            if (NULL == impl->logs)
                break;
        }

        if (mpp_frame_init(&impl->info))
            break;

        if (mpp_frame_init(&impl->info_set))
            break;

        // slots information default setup
        impl->hal_hor_align = default_align_16;
        impl->hal_ver_align = default_align_16;
        impl->hal_len_align = NULL;
        impl->numerator     = 9;
        impl->denominator   = 5;
        impl->slots_idx     = buf_slot_idx++;
        impl->info_change_slot_idx = -1;
        impl->align_chk_log_env = (buf_slot_debug & BUF_SLOT_DBG_INFO_SET) ? 1 : 0;
        impl->align_chk_log_en = impl->align_chk_log_env;

        *slots = impl;
        return MPP_OK;
    } while (0);

    clear_slots_impl(impl);

    *slots = NULL;
    return MPP_NOK;
}